

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O2

IterateResult __thiscall glcts::ViewportArray::ScissorAPI::iterate(ScissorAPI *this)

{
  int *piVar1;
  int *piVar2;
  pointer piVar3;
  int iVar4;
  undefined1 auVar5 [16];
  int iVar6;
  deUint32 dVar7;
  undefined4 extraout_var;
  ulong uVar9;
  NotSupportedError *this_00;
  GLint i;
  long lVar10;
  char *description;
  GLint i_1;
  int iVar11;
  ulong uVar12;
  GLint i_3;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  bool test_result;
  GLint max_viewports;
  vector<int,_std::allocator<int>_> scissor_box_data_b;
  vector<int,_std::allocator<int>_> scissor_box_data_a;
  long lVar8;
  
  if ((this->super_TestCaseBase).m_is_viewport_array_supported != false) {
    iVar6 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar8 = CONCAT44(extraout_var,iVar6);
    test_result = true;
    max_viewports = 0;
    (**(code **)(lVar8 + 0x868))(0x825b,&max_viewports);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"GetIntegerv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                    ,0x797);
    scissor_box_data_a.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage = (pointer)0x0;
    scissor_box_data_b.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage = (pointer)0x0;
    scissor_box_data_a.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)0x0;
    scissor_box_data_a.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_finish = (pointer)0x0;
    scissor_box_data_b.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)0x0;
    scissor_box_data_b.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_finish = (pointer)0x0;
    std::vector<int,_std::allocator<int>_>::resize
              (&scissor_box_data_a,(ulong)(uint)(max_viewports << 2));
    std::vector<int,_std::allocator<int>_>::resize
              (&scissor_box_data_b,(ulong)(uint)(max_viewports << 2));
    getScissorBoxes(this,max_viewports,&scissor_box_data_a);
    auVar5 = _DAT_017dc2f0;
    uVar14 = 0;
    for (lVar10 = 0; lVar10 < max_viewports; lVar10 = lVar10 + 1) {
      piVar1 = scissor_box_data_a.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + uVar14;
      iVar6 = piVar1[1];
      iVar11 = piVar1[2];
      iVar4 = piVar1[3];
      piVar2 = scissor_box_data_a.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + uVar14;
      *piVar2 = *piVar1 + auVar5._0_4_;
      piVar2[1] = iVar6 + auVar5._4_4_;
      piVar2[2] = iVar11 + auVar5._8_4_;
      piVar2[3] = iVar4 + auVar5._12_4_;
      uVar14 = uVar14 + 4;
    }
    (**(code **)(lVar8 + 0x1298))
              (0,(long)max_viewports,
               scissor_box_data_a.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"scissorArrayv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                    ,0x7b0);
    getScissorBoxes(this,max_viewports,&scissor_box_data_b);
    compareScissorBoxes(this,&scissor_box_data_a,&scissor_box_data_b,"scissorArrayv",&test_result);
    uVar14 = 0;
    for (uVar12 = 0; uVar9 = (ulong)max_viewports, (long)uVar12 < (long)uVar9; uVar12 = uVar12 + 1)
    {
      piVar3 = scissor_box_data_b.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + uVar14;
      piVar3[0] = 4;
      piVar3[1] = 4;
      piVar3[2] = 8;
      piVar3[3] = 8;
      (**(code **)(lVar8 + 0x12a0))(uVar12 & 0xffffffff,4,4,8,8);
      dVar7 = (**(code **)(lVar8 + 0x800))();
      glu::checkError(dVar7,"scissorIndexed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                      ,0x7c2);
      getScissorBoxes(this,max_viewports,&scissor_box_data_a);
      compareScissorBoxes(this,&scissor_box_data_a,&scissor_box_data_b,"scissorIndexed",&test_result
                         );
      uVar14 = uVar14 + 4;
    }
    uVar14 = 0;
    for (uVar12 = 0; (long)uVar12 < (long)(int)uVar9; uVar12 = uVar12 + 1) {
      piVar3 = scissor_box_data_a.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + uVar14;
      piVar3[0] = 8;
      piVar3[1] = 8;
      piVar3[2] = 0xc;
      piVar3[3] = 0xc;
      (**(code **)(lVar8 + 0x12a8))(uVar12 & 0xffffffff);
      dVar7 = (**(code **)(lVar8 + 0x800))();
      glu::checkError(dVar7,"scissorIndexedv",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                      ,0x7d5);
      getScissorBoxes(this,max_viewports,&scissor_box_data_b);
      compareScissorBoxes(this,&scissor_box_data_a,&scissor_box_data_b,"scissorIndexedv",
                          &test_result);
      uVar9 = (ulong)(uint)max_viewports;
      uVar14 = uVar14 + 4;
    }
    uVar12 = 7;
    uVar9 = 0;
    uVar15 = 0;
    while (uVar13 = (ulong)max_viewports, (long)uVar15 < (long)uVar13) {
      iVar6 = ((uint)uVar15 & 1) * 3 + 1;
      for (uVar13 = 0; uVar9 != uVar13; uVar13 = uVar13 + 4) {
        piVar1 = scissor_box_data_b.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + (uVar13 & 0xffffffff);
        *piVar1 = iVar6;
        piVar1[1] = iVar6;
        piVar1[2] = iVar6;
        piVar1[3] = iVar6;
      }
      uVar15 = uVar15 + 1;
      iVar11 = (int)uVar12;
      uVar13 = uVar15 & 0xffffffff;
      while( true ) {
        if (max_viewports <= (int)uVar13) break;
        iVar4 = (int)uVar12;
        scissor_box_data_b.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[iVar4 - 3] = iVar6;
        scissor_box_data_b.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[iVar4 - 2] = iVar6;
        scissor_box_data_b.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[iVar4 - 1] = iVar6;
        scissor_box_data_b.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar12] = iVar6;
        uVar13 = (ulong)((int)uVar13 + 1);
        uVar12 = (ulong)(iVar4 + 4);
      }
      (**(code **)(lVar8 + 0x1298))
                (0,max_viewports,
                 scissor_box_data_b.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start);
      dVar7 = (**(code **)(lVar8 + 0x800))();
      glu::checkError(dVar7,"scissorArrayv",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                      ,0x7f5);
      getScissorBoxes(this,max_viewports,&scissor_box_data_a);
      uVar9 = uVar9 + 4;
      uVar12 = (ulong)(iVar11 + 4);
      compareScissorBoxes(this,&scissor_box_data_a,&scissor_box_data_b,"scissorArrayv",&test_result)
      ;
    }
    uVar14 = 0;
    for (lVar10 = 0; lVar10 < (int)uVar13; lVar10 = lVar10 + 1) {
      piVar3 = scissor_box_data_a.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + uVar14;
      piVar3[0] = 0;
      piVar3[1] = 0;
      *(undefined1 **)(piVar3 + 2) = &DAT_100000001;
      uVar14 = uVar14 + 4;
      uVar13 = (ulong)(uint)max_viewports;
    }
    (**(code **)(lVar8 + 0x1290))(0,0,1);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"scissor",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                    ,0x808);
    getScissorBoxes(this,max_viewports,&scissor_box_data_b);
    compareScissorBoxes(this,&scissor_box_data_a,&scissor_box_data_b,"scissor",&test_result);
    description = "Fail";
    if (test_result != QP_TEST_RESULT_PASS) {
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              (((this->super_TestCaseBase).m_context)->m_testCtx,test_result ^ QP_TEST_RESULT_FAIL,
               description);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&scissor_box_data_b.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&scissor_box_data_a.super__Vector_base<int,_std::allocator<int>_>);
    return STOP;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"Viewport array functionality not supported, skipping",
             fixed_sample_locations_values + 1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
             ,0x78b);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult ScissorAPI::iterate()
{
	if (!m_is_viewport_array_supported)
	{
		throw tcu::NotSupportedError(VIEWPORT_ARRAY_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Test result */
	bool test_result = true;

	GLint max_viewports = 0;

	gl.getIntegerv(GL_MAX_VIEWPORTS, &max_viewports);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegerv");

	std::vector<GLint> scissor_box_data_a;
	std::vector<GLint> scissor_box_data_b;

	scissor_box_data_a.resize(max_viewports * m_n_elements);
	scissor_box_data_b.resize(max_viewports * m_n_elements);

	/*
	 *   - get initial dimensions of SCISSOR_BOX for all MAX_VIEWPORTS indices;
	 *   - change location and dimensions of all indices at once with
	 *   ScissorArrayv;
	 *   - get SCISSOR_BOX for all MAX_VIEWPORTS indices and verify results;
	 */
	getScissorBoxes(max_viewports, scissor_box_data_a);

	for (GLint i = 0; i < max_viewports; ++i)
	{
		scissor_box_data_a[i * m_n_elements + 0] += 1;
		scissor_box_data_a[i * m_n_elements + 1] += 1;
		scissor_box_data_a[i * m_n_elements + 2] -= 1;
		scissor_box_data_a[i * m_n_elements + 3] -= 1;
	}

	gl.scissorArrayv(0, max_viewports, &scissor_box_data_a[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "scissorArrayv");

	getScissorBoxes(max_viewports, scissor_box_data_b);
	compareScissorBoxes(scissor_box_data_a, scissor_box_data_b, "scissorArrayv", test_result);

	/*
	 *   - for each index:
	 *     * modify with ScissorIndexed,
	 *     * get SCISSOR_BOX for all MAX_VIEWPORTS indices and verify results;
	 */
	for (GLint i = 0; i < max_viewports; ++i)
	{
		scissor_box_data_b[i * m_n_elements + 0] = 4;
		scissor_box_data_b[i * m_n_elements + 1] = 4;
		scissor_box_data_b[i * m_n_elements + 2] = 8;
		scissor_box_data_b[i * m_n_elements + 3] = 8;

		gl.scissorIndexed(i, 4, 4, 8, 8);
		GLU_EXPECT_NO_ERROR(gl.getError(), "scissorIndexed");

		getScissorBoxes(max_viewports, scissor_box_data_a);
		compareScissorBoxes(scissor_box_data_a, scissor_box_data_b, "scissorIndexed", test_result);
	}

	/*
	 *   - for each index:
	 *     * modify with ScissorIndexedv,
	 *     * get SCISSOR_BOX for all MAX_VIEWPORTS indices and verify results;
	 */
	for (GLint i = 0; i < max_viewports; ++i)
	{
		scissor_box_data_a[i * m_n_elements + 0] = 8;
		scissor_box_data_a[i * m_n_elements + 1] = 8;
		scissor_box_data_a[i * m_n_elements + 2] = 12;
		scissor_box_data_a[i * m_n_elements + 3] = 12;

		gl.scissorIndexedv(i, &scissor_box_data_a[i * m_n_elements]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "scissorIndexedv");

		getScissorBoxes(max_viewports, scissor_box_data_b);
		compareScissorBoxes(scissor_box_data_a, scissor_box_data_b, "scissorIndexedv", test_result);
	}

	/*
	 *   - for each index:
	 *     * modify all indices before and after current one with ScissorArrayv,
	 *     * get SCISSOR_BOX for all MAX_VIEWPORTS indices and verify results;
	 */
	for (GLint i = 0; i < max_viewports; ++i)
	{
		const GLint value = (0 == i % 2) ? 1 : 4;

		for (GLint j = 0; j < i; ++j)
		{
			scissor_box_data_b[j * m_n_elements + 0] = value;
			scissor_box_data_b[j * m_n_elements + 1] = value;
			scissor_box_data_b[j * m_n_elements + 2] = value;
			scissor_box_data_b[j * m_n_elements + 3] = value;
		}

		for (GLint j = i + 1; j < max_viewports; ++j)
		{
			scissor_box_data_b[j * m_n_elements + 0] = value;
			scissor_box_data_b[j * m_n_elements + 1] = value;
			scissor_box_data_b[j * m_n_elements + 2] = value;
			scissor_box_data_b[j * m_n_elements + 3] = value;
		}

		gl.scissorArrayv(0, max_viewports, &scissor_box_data_b[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "scissorArrayv");

		getScissorBoxes(max_viewports, scissor_box_data_a);
		compareScissorBoxes(scissor_box_data_a, scissor_box_data_b, "scissorArrayv", test_result);
	}

	/*
	 *   - change location and dimensions of all indices at once with Scissor;
	 *   - get SCISSOR_BOX for all MAX_VIEWPORTS indices and verify results;
	 */
	for (GLint i = 0; i < max_viewports; ++i)
	{
		scissor_box_data_a[i * m_n_elements + 0] = 0;
		scissor_box_data_a[i * m_n_elements + 1] = 0;
		scissor_box_data_a[i * m_n_elements + 2] = 1;
		scissor_box_data_a[i * m_n_elements + 3] = 1;
	}

	gl.scissor(0, 0, 1, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "scissor");

	getScissorBoxes(max_viewports, scissor_box_data_b);
	compareScissorBoxes(scissor_box_data_a, scissor_box_data_b, "scissor", test_result);

	/* Set result */
	if (true == test_result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return tcu::TestNode::STOP;
}